

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_map.hpp
# Opt level: O2

bool __thiscall tcmalloc::PageMap::Set(PageMap *this,uint64_t key,void *value)

{
  void ***pppvVar1;
  void *pvVar2;
  void **ppvVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar4 = key >> 0x2a;
  pppvVar1 = this->roots[uVar4];
  if (pppvVar1 == (void ***)0x0) {
    pppvVar1 = (void ***)Alloc(this,INTERNAL);
    this->roots[uVar4] = pppvVar1;
    if (pppvVar1 == (void ***)0x0) {
      return false;
    }
  }
  uVar5 = (uint)(key >> 0x14) & 0x3fffff;
  ppvVar3 = pppvVar1[uVar5];
  if (ppvVar3 == (void **)0x0) {
    pvVar2 = Alloc(this,LEAF);
    uVar6 = (ulong)(uVar5 << 3);
    *(void **)((long)this->roots[uVar4] + uVar6) = pvVar2;
    ppvVar3 = *(void ***)((long)this->roots[uVar4] + uVar6);
    if (ppvVar3 == (void **)0x0) {
      return false;
    }
  }
  ppvVar3[(uint)key & 0xfffff] = value;
  return true;
}

Assistant:

bool Set(uint64_t key, void *value) {
        uint64_t k1 = key >> (internal_bits + leaf_bits);
        uint64_t k2 = (key >> leaf_bits) & ((1<<internal_bits) - 1);
        uint64_t k3 = key & ((1<<leaf_bits) -1);
        if (roots[k1] == nullptr) {
            roots[k1] = reinterpret_cast<void ***>(Alloc(INTERNAL));
            if (roots[k1] == nullptr) {
                return false;
            }
        }
        if (roots[k1][k2] == nullptr) {
            roots[k1][k2] = reinterpret_cast<void **>(Alloc(LEAF));
            if (roots[k1][k2] == nullptr) {
                return false;
            }
        }
        roots[k1][k2][k3] = value;
        return true;
    }